

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

void tcu::astc::anon_unknown_0::generateRandomBlock(deUint8 *dst,IVec3 *blockSize,Random *rnd)

{
  bool bVar1;
  ISEMode IVar2;
  ISEParams IVar3;
  bool bVar4;
  deFloat16 dVar5;
  int i;
  deBool dVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  deUint32 dVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ISEParams IVar14;
  byte bVar15;
  NormalBlockISEInputs *iseInputs_00;
  long lVar16;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ulong uVar17;
  int iVar18;
  int iVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  deUint8 *pdVar22;
  int i_1;
  ISEMode IVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  AssignBlock128 AVar27;
  NormalBlockISEInputs iseInputs;
  NormalBlockParams local_ca4;
  deUint8 *local_c70;
  ulong local_c68;
  ulong local_c60;
  ulong local_c58;
  ISEParams local_c50;
  ulong local_c48;
  ulong local_c40;
  undefined1 local_c38 [3080];
  
  fVar26 = deRandom_getFloat(&rnd->m_rnd);
  if (0.1 <= fVar26) {
    local_ca4.isDualPlane = true;
    local_ca4.ccs = 0xffffffff;
    local_ca4.partitionSeed = 0xffffffff;
    local_ca4.colorEndpointModes[0] = 0;
    local_ca4.colorEndpointModes[1] = 0;
    local_ca4.colorEndpointModes[2] = 0;
    local_ca4.colorEndpointModes[3] = 0;
    iVar19 = blockSize->m_data[0];
    local_c70 = dst;
    do {
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      iVar18 = 0;
      local_ca4.weightGridWidth = dVar10 % (iVar19 - 1U) + 2;
      iVar19 = blockSize->m_data[1];
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      local_ca4.weightGridHeight = dVar10 % (iVar19 - 1U) + 2;
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      local_ca4.weightISEParams =
           *(ISEParams *)(&astc::(anonymous_namespace)::s_weightISEParamsCandidates + dVar10 % 0xc);
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      uVar9 = dVar10 & 3;
      local_ca4.numPartitions = uVar9 + 1;
      fVar26 = deRandom_getFloat(&rnd->m_rnd);
      local_ca4.isMultiPartSingleCemMode = fVar26 < 0.25;
      bVar24 = false;
      if (uVar9 + 1 != 4) {
        dVar6 = deRandom_getBool(&rnd->m_rnd);
        bVar24 = dVar6 == 1;
      }
      local_ca4.isDualPlane = bVar24;
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      local_ca4.ccs = dVar10 & 3;
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      local_ca4.partitionSeed = dVar10 & 0x3ff;
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      uVar11 = dVar10 & 0xf;
      local_ca4.colorEndpointModes._0_8_ =
           CONCAT44(local_ca4.colorEndpointModes[1],dVar10) & 0xffffffff0000000f;
      if (0.25 <= fVar26) {
        if (uVar11 == 0) {
          iVar18 = 1;
        }
        else if (uVar11 == 0xf) {
          iVar18 = -1;
        }
        else {
          dVar6 = deRandom_getBool(&rnd->m_rnd);
          iVar18 = (uint)(dVar6 == 1) * 2 + -1;
        }
      }
      if (uVar9 != 0) {
        uVar17 = 0;
        do {
          if (iVar18 == 1) {
            dVar10 = deRandom_getUint32(&rnd->m_rnd);
            uVar12 = dVar10 & 1;
          }
          else {
            uVar12 = 0;
            if (iVar18 == -1) {
              dVar10 = deRandom_getUint32(&rnd->m_rnd);
              uVar12 = (dVar10 & 1) - 1;
            }
          }
          local_ca4.colorEndpointModes[uVar17 + 1] = uVar12 + uVar11;
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
      }
      iVar19 = blockSize->m_data[0];
      bVar4 = isValidBlockParams(&local_ca4,iVar19,blockSize->m_data[1]);
      bVar24 = local_ca4.isMultiPartSingleCemMode;
      IVar3 = local_ca4.weightISEParams;
    } while (!bVar4);
    local_c38[0] = 0;
    local_c38[0x604] = 0;
    bVar4 = 0 < local_ca4.numPartitions;
    local_c58 = (ulong)(uint)local_ca4.numPartitions;
    uVar11 = local_ca4.weightGridHeight * local_ca4.weightGridWidth <<
             (local_ca4.isDualPlane & 0x1fU);
    uVar9 = ((local_ca4.colorEndpointModes[0] >> 2) * 2 + 2) * local_ca4.numPartitions;
    iVar19 = local_ca4.weightISEParams.numBits * uVar11;
    local_c60 = (ulong)(((int)(uVar11 * 7) / 3 + iVar19 + 1) -
                       (uint)(uVar11 * -0x55555553 + 0x2aaaaaaa < 0x55555555));
    local_c48 = (ulong)uVar11;
    local_c68 = (ulong)(((int)(uVar11 * 8) / 5 + iVar19 + 1) -
                       (uint)(uVar11 * 0x66666668 + 0x19999999 < 0x33333333));
    bVar15 = ~local_ca4.isDualPlane;
    iseInputs_00 = (NormalBlockISEInputs *)(ulong)(bVar15 & 1);
    bVar25 = (local_ca4.isMultiPartSingleCemMode & 1U) == 0;
    if (bVar25) {
      uVar9 = 0;
    }
    IVar2 = local_ca4.weightISEParams.mode;
    iVar18 = -0x1d;
    if (bVar25) {
      iVar18 = local_ca4.numPartitions * -3 + -0x19;
    }
    local_c50 = local_ca4.weightISEParams;
    iVar7 = -0x11;
    if (local_ca4.numPartitions != 1) {
      iVar7 = iVar18;
    }
    bVar25 = true;
    do {
      bVar1 = bVar25;
      puVar20 = local_c38;
      IVar14 = local_c50;
      uVar17 = local_c48;
      if (!bVar1) {
        uVar17 = (ulong)uVar9;
        if (bVar4 && (bVar24 & 1U) == 0) {
          uVar13 = 0;
          uVar17 = 0;
          do {
            uVar17 = (ulong)((int)uVar17 + (local_ca4.colorEndpointModes[uVar13] >> 2) * 2 + 2);
            uVar13 = uVar13 + 1;
          } while (local_c58 != uVar13);
        }
        iseInputs_00 = (NormalBlockISEInputs *)((ulong)IVar3 & 0xffffffff);
        iVar18 = iVar19;
        if (((IVar2 != ISEMODE_PLAIN_BIT) && (iVar18 = (int)local_c60, IVar2 != ISEMODE_QUINT)) &&
           (iVar18 = -1, IVar2 == ISEMODE_TRIT)) {
          iVar18 = (int)local_c68;
        }
        IVar14 = computeMaximumRangeISEParams
                           ((((bVar15 & 1) * 2 + 0x7e) - iVar18) + iVar7,(int)uVar17);
        puVar20 = local_c38 + 0x604;
      }
      dVar6 = deRandom_getBool(&rnd->m_rnd);
      *puVar20 = dVar6 == 1;
      IVar23 = IVar14.mode;
      if (dVar6 == 1) {
        uVar11 = (uint)(IVar23 == ISEMODE_QUINT) * 2 + 1;
        if (IVar23 == ISEMODE_TRIT) {
          uVar11 = 5;
        }
        uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
        uVar12 = (uint)((long)uVar17 % (long)(int)uVar11);
        uVar8 = ((int)((long)uVar17 / (long)(int)uVar11) + 1) - (uint)(uVar12 == 0);
        if (0 < (int)uVar8) {
          local_c40 = (ulong)uVar8;
          puVar21 = puVar20 + 8;
          uVar17 = 0;
          do {
            dVar10 = deRandom_getUint32(&rnd->m_rnd);
            iseInputs_00 = (NormalBlockISEInputs *)(uVar17 * 3);
            *(deUint32 *)(puVar20 + uVar17 * 0x18 + 4) = dVar10 & 0xff;
            uVar13 = 0;
            do {
              dVar10 = deRandom_getUint32(&rnd->m_rnd);
              *(deUint32 *)(puVar21 + uVar13 * 4) = dVar10 & ~(-1 << ((byte)IVar14.numBits & 0x1f));
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
            uVar17 = uVar17 + 1;
            puVar21 = puVar21 + 0x18;
            uVar12 = extraout_EDX_00;
          } while (uVar17 != local_c40);
        }
      }
      else {
        if (IVar23 == ISEMODE_PLAIN_BIT) {
          iVar18 = 1;
LAB_019c7757:
          uVar11 = iVar18 << ((byte)IVar14.numBits & 0x1f);
          iseInputs_00 = (NormalBlockISEInputs *)((ulong)IVar14 >> 0x20);
        }
        else {
          if (IVar23 == ISEMODE_QUINT) {
            iVar18 = 5;
            goto LAB_019c7757;
          }
          uVar11 = 0;
          if (IVar23 == ISEMODE_TRIT) {
            iVar18 = 3;
            goto LAB_019c7757;
          }
        }
        uVar12 = extraout_EDX;
        if (0 < (int)uVar17) {
          uVar13 = 0;
          do {
            dVar10 = deRandom_getUint32(&rnd->m_rnd);
            uVar12 = dVar10 % uVar11;
            *(uint *)(puVar20 + uVar13 * 4 + 4) = uVar12;
            uVar13 = uVar13 + 1;
          } while ((uVar17 & 0xffffffff) != uVar13);
        }
      }
      bVar25 = false;
    } while (bVar1);
    AVar27 = generateNormalBlock(&local_ca4,(int)local_c38,uVar12,iseInputs_00);
    lVar16 = 0;
    uVar17 = AVar27.m_words[0];
    bVar24 = true;
    do {
      bVar4 = bVar24;
      pdVar22 = local_c70 + lVar16;
      lVar16 = 0;
      do {
        *pdVar22 = (deUint8)(uVar17 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + 8;
        pdVar22 = pdVar22 + 1;
      } while (lVar16 != 0x40);
      lVar16 = 8;
      uVar17 = AVar27.m_words[1];
      bVar24 = false;
    } while (bVar4);
  }
  else {
    dVar6 = deRandom_getBool(&rnd->m_rnd);
    if (dVar6 == 1) {
      fVar26 = deRandom_getFloat(&rnd->m_rnd);
      dVar5 = deFloat32To16(fVar26 + 0.0);
      uVar9 = (uint)dVar5;
      fVar26 = deRandom_getFloat(&rnd->m_rnd);
      dVar5 = deFloat32To16(fVar26 + 0.0);
      dVar10 = (deUint32)dVar5;
      fVar26 = deRandom_getFloat(&rnd->m_rnd);
      dVar5 = deFloat32To16(fVar26 + 0.0);
      uVar11 = (uint)dVar5;
      fVar26 = deRandom_getFloat(&rnd->m_rnd);
      dVar5 = deFloat32To16(fVar26 + 0.0);
      uVar12 = (uint)dVar5;
      uVar17 = 0xfffffffffffffffc;
    }
    else {
      uVar9 = deRandom_getUint32(&rnd->m_rnd);
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      uVar11 = deRandom_getUint32(&rnd->m_rnd);
      uVar12 = deRandom_getUint32(&rnd->m_rnd);
      uVar17 = 0xfffffffffffffdfc;
    }
    lVar16 = 0;
    bVar24 = true;
    do {
      bVar4 = bVar24;
      pdVar22 = dst + lVar16;
      lVar16 = 0;
      do {
        *pdVar22 = (deUint8)(uVar17 >> ((byte)lVar16 & 0x3f));
        lVar16 = lVar16 + 8;
        pdVar22 = pdVar22 + 1;
      } while (lVar16 != 0x40);
      lVar16 = 8;
      uVar17 = (ulong)(uVar12 & 0xffff) << 0x30 |
               CONCAT44(uVar11,dVar10 << 0x10 | uVar9 & 0xffff) & 0xffffffffffff;
      bVar24 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

void generateRandomBlock (deUint8* dst, const IVec3& blockSize, de::Random& rnd)
{
	DE_ASSERT(blockSize.z() == 1);

	if (rnd.getFloat() < 0.1f)
	{
		// Void extent block.
		const bool		isVoidExtentHDR		= rnd.getBool();
		const deUint16	r					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	g					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	b					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	a					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		generateVoidExtentBlock(VoidExtentParams(isVoidExtentHDR, r, g, b, a)).assignToMemory(dst);
	}
	else
	{
		// Not void extent block.

		// Generate block params.

		NormalBlockParams blockParams;

		do
		{
			blockParams.weightGridWidth				= rnd.getInt(2, blockSize.x());
			blockParams.weightGridHeight			= rnd.getInt(2, blockSize.y());
			blockParams.weightISEParams				= s_weightISEParamsCandidates[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates)-1)];
			blockParams.numPartitions				= rnd.getInt(1, 4);
			blockParams.isMultiPartSingleCemMode	= rnd.getFloat() < 0.25f;
			blockParams.isDualPlane					= blockParams.numPartitions != 4 && rnd.getBool();
			blockParams.ccs							= rnd.getInt(0, 3);
			blockParams.partitionSeed				= rnd.getInt(0, 1023);

			blockParams.colorEndpointModes[0] = rnd.getInt(0, 15);

			{
				const int cemDiff = blockParams.isMultiPartSingleCemMode		? 0
									: blockParams.colorEndpointModes[0] == 0	? 1
									: blockParams.colorEndpointModes[0] == 15	? -1
									: rnd.getBool()								? 1 : -1;

				for (int i = 1; i < blockParams.numPartitions; i++)
					blockParams.colorEndpointModes[i] = blockParams.colorEndpointModes[0] + (cemDiff == -1 ? rnd.getInt(-1, 0) : cemDiff == 1 ? rnd.getInt(0, 1) : 0);
			}
		} while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()));

		// Generate ISE inputs for both weight and endpoint data.

		NormalBlockISEInputs iseInputs;

		for (int weightOrEndpoints = 0; weightOrEndpoints <= 1; weightOrEndpoints++)
		{
			const bool			setWeights	= weightOrEndpoints == 0;
			const int			numValues	= setWeights ? computeNumWeights(blockParams) :
												computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
			const ISEParams		iseParams	= setWeights ? blockParams.weightISEParams : computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams), numValues);
			ISEInput&			iseInput	= setWeights ? iseInputs.weight : iseInputs.endpoint;

			iseInput.isGivenInBlockForm = rnd.getBool();

			if (iseInput.isGivenInBlockForm)
			{
				const int numValuesPerISEBlock	= iseParams.mode == ISEMODE_TRIT	? 5
												: iseParams.mode == ISEMODE_QUINT	? 3
												:									  1;
				const int iseBitMax				= (1 << iseParams.numBits) - 1;
				const int numISEBlocks			= deDivRoundUp32(numValues, numValuesPerISEBlock);

				for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocks; iseBlockNdx++)
				{
					iseInput.value.block[iseBlockNdx].tOrQValue = rnd.getInt(0, 255);
					for (int i = 0; i < numValuesPerISEBlock; i++)
						iseInput.value.block[iseBlockNdx].bitValues[i] = rnd.getInt(0, iseBitMax);
				}
			}
			else
			{
				const int rangeMax = computeISERangeMax(iseParams);

				for (int valueNdx = 0; valueNdx < numValues; valueNdx++)
					iseInput.value.plain[valueNdx] = rnd.getInt(0, rangeMax);
			}
		}

		generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).assignToMemory(dst);
	}
}